

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::completerActivated(QComboBoxPrivate *this,QModelIndex *index)

{
  QComboBox *this_00;
  QLineEdit *this_01;
  MatchFlags flags;
  int iVar1;
  QCompleter *pQVar2;
  long *plVar3;
  QAbstractItemModel *pQVar4;
  long in_FS_OFFSET;
  QArrayData *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  int local_68 [4];
  QAbstractItemModel *local_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
    this_01 = *(QLineEdit **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x2a0);
    if ((this_01 != (QLineEdit *)0x0) &&
       (pQVar2 = QLineEdit::completer(this_01), pQVar2 != (QCompleter *)0x0)) {
      pQVar2 = QLineEdit::completer
                         (*(QLineEdit **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x2a0));
      QCompleter::completionModel(pQVar2);
      plVar3 = (long *)QMetaObject::cast((QObject *)&QAbstractProxyModel::staticMetaObject);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 400))(local_68,plVar3,index);
        if (local_58 != this->model) {
          pQVar2 = QLineEdit::completer
                             (*(QLineEdit **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x2a0))
          ;
          QCompleter::model(pQVar2);
          plVar3 = (long *)QMetaObject::cast((QObject *)&QAbstractProxyModel::staticMetaObject);
          if ((plVar3 == (long *)0x0) ||
             (pQVar4 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel(),
             pQVar4 != this->model)) {
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar2 = QLineEdit::completer
                               (*(QLineEdit **)
                                 (*(long *)&(this_00->super_QWidget).field_0x8 + 0x2a0));
            pQVar4 = QCompleter::model(pQVar2);
            (**(code **)(*(long *)pQVar4 + 0x90))(&local_50,pQVar4,local_68,0);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_50);
            flags = matchFlags(this);
            ::QVariant::QVariant((QVariant *)&local_50,(QString *)&local_88);
            iVar1 = QComboBox::findData(this_00,(QVariant *)&local_50,0,flags);
            ::QVariant::~QVariant((QVariant *)&local_50);
            local_68[0] = iVar1;
            if (local_88 != (QArrayData *)0x0) {
              LOCK();
              (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_88,2,0x10);
              }
            }
          }
          else {
            (**(code **)(*plVar3 + 400))(&local_50,plVar3,local_68);
            local_68[0] = local_50._0_4_;
          }
        }
        QComboBox::setCurrentIndex(this_00,local_68[0]);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_50,&this->currentIndex);
        emitActivated(this,(QModelIndex *)&local_50);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::completerActivated(const QModelIndex &index)
{
    Q_Q(QComboBox);
#if QT_CONFIG(proxymodel)
    if (index.isValid() && q->completer()) {
        QAbstractProxyModel *proxy = qobject_cast<QAbstractProxyModel *>(q->completer()->completionModel());
        if (proxy) {
            const QModelIndex &completerIndex = proxy->mapToSource(index);
            int row = -1;
            if (completerIndex.model() == model) {
                row = completerIndex.row();
            } else {
                // if QCompleter uses a proxy model to host widget's one - map again
                QAbstractProxyModel *completerProxy = qobject_cast<QAbstractProxyModel *>(q->completer()->model());
                if (completerProxy && completerProxy->sourceModel() == model) {
                    row = completerProxy->mapToSource(completerIndex).row();
                } else {
                    QString match = q->completer()->model()->data(completerIndex).toString();
                    row = q->findText(match, matchFlags());
                }
            }
            q->setCurrentIndex(row);
            emitActivated(currentIndex);
        }
    }
#endif
}